

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::WriteTailCallStack(CWriter *this)

{
  Newline *extraout_RDX;
  Newline *extraout_RDX_00;
  Newline *u;
  Newline *extraout_RDX_01;
  Newline *extraout_RDX_02;
  Newline *pNVar1;
  string __str;
  long *local_38;
  uint local_30;
  undefined4 uStack_2c;
  long local_28 [2];
  
  WriteData(this,"void *instance_ptr_storage;",0x1b);
  pNVar1 = extraout_RDX;
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    pNVar1 = extraout_RDX_00;
  }
  this->should_write_indent_next_ = true;
  (anonymous_namespace)::CWriter::Write<char_const(&)[45],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [45])"void **instance_ptr = &instance_ptr_storage;",pNVar1);
  local_38 = local_28;
  std::__cxx11::string::_M_construct((ulong)&local_38,'\x04');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_38,local_30,0x400);
  WriteData(this,"char tail_call_stack[",0x15);
  WriteData(this,(char *)local_38,CONCAT44(uStack_2c,local_30));
  (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [3])0x171af4,u);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  WriteData(this,"wasm_rt_tailcallee_t next_storage;",0x22);
  pNVar1 = extraout_RDX_01;
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    pNVar1 = extraout_RDX_02;
  }
  this->should_write_indent_next_ = true;
  (anonymous_namespace)::CWriter::Write<char_const(&)[44],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [44])"wasm_rt_tailcallee_t *next = &next_storage;",pNVar1);
  return;
}

Assistant:

void CWriter::WriteTailCallStack() {
  Write("void *instance_ptr_storage;", Newline());
  Write("void **instance_ptr = &instance_ptr_storage;", Newline());
  Write("char tail_call_stack[", std::to_string(kTailCallStackSize), "];",
        Newline());
  Write("wasm_rt_tailcallee_t next_storage;", Newline());
  Write("wasm_rt_tailcallee_t *next = &next_storage;", Newline());
}